

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::FixupFirstLefts2(Clipper *this,OutRec *InnerOutRec,OutRec *OuterOutRec)

{
  OutRec *pOVar1;
  value_type pOVar2;
  bool bVar3;
  OutRec *pOVar4;
  reference ppOVar5;
  OutRec *firstLeft;
  OutRec *outRec;
  size_type i;
  OutRec *orfl;
  OutRec *OuterOutRec_local;
  OutRec *InnerOutRec_local;
  Clipper *this_local;
  
  pOVar1 = OuterOutRec->FirstLeft;
  for (outRec = (OutRec *)0x0;
      pOVar4 = (OutRec *)
               std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                         ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                          ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3])),
      outRec < pOVar4; outRec = (OutRec *)((long)&outRec->Idx + 1)) {
    ppOVar5 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                         ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),(size_type)outRec
                        );
    pOVar2 = *ppOVar5;
    if ((((pOVar2->Pts != (OutPt *)0x0) && (pOVar2 != OuterOutRec)) && (pOVar2 != InnerOutRec)) &&
       (((pOVar4 = ParseFirstLeft(pOVar2->FirstLeft), pOVar4 == pOVar1 || (pOVar4 == InnerOutRec))
        || (pOVar4 == OuterOutRec)))) {
      bVar3 = Poly2ContainsPoly1(pOVar2->Pts,InnerOutRec->Pts);
      if (bVar3) {
        pOVar2->FirstLeft = InnerOutRec;
      }
      else {
        bVar3 = Poly2ContainsPoly1(pOVar2->Pts,OuterOutRec->Pts);
        if (bVar3) {
          pOVar2->FirstLeft = OuterOutRec;
        }
        else if ((pOVar2->FirstLeft == InnerOutRec) || (pOVar2->FirstLeft == OuterOutRec)) {
          pOVar2->FirstLeft = pOVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts2(OutRec* InnerOutRec, OutRec* OuterOutRec)
{
  //A polygon has split into two such that one is now the inner of the other.
  //It's possible that these polygons now wrap around other polygons, so check
  //every polygon that's also contained by OuterOutRec's FirstLeft container
  //(including 0) to see if they've become inner to the new inner polygon ...
  OutRec* orfl = OuterOutRec->FirstLeft;
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];

    if (!outRec->Pts || outRec == OuterOutRec || outRec == InnerOutRec)
      continue;
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (firstLeft != orfl && firstLeft != InnerOutRec && firstLeft != OuterOutRec)
      continue;
    if (Poly2ContainsPoly1(outRec->Pts, InnerOutRec->Pts))
      outRec->FirstLeft = InnerOutRec;
    else if (Poly2ContainsPoly1(outRec->Pts, OuterOutRec->Pts))
      outRec->FirstLeft = OuterOutRec;
    else if (outRec->FirstLeft == InnerOutRec || outRec->FirstLeft == OuterOutRec)
      outRec->FirstLeft = orfl;
  }
}